

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

void duckdb::Leaf::DeprecatedFree(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  type paVar2;
  long *plVar3;
  pointer this;
  data_ptr_t pdVar4;
  __hash_code __code;
  long *plVar5;
  ulong uVar6;
  
  uVar6 = (node->super_IndexPointer).data;
  if (uVar6 >> 0x38 != 0) {
    do {
      paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar2->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar3 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar6 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar5 = (long *)*plVar3; (uVar6 & 0xffffffff) != plVar5[1]; plVar5 = (long *)*plVar5) {
        plVar3 = plVar5;
      }
      this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar3 + 0x10));
      pdVar4 = FixedSizeBuffer::Get(this,true);
      uVar6 = *(ulong *)(pdVar4 + (_Var1._M_head_impl)->bitmask_offset + 0x28 +
                                  (ulong)((uint)(uVar6 >> 0x20) & 0xffffff) *
                                  (_Var1._M_head_impl)->segment_size);
      paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      FixedSizeAllocator::Free
                (paVar2->_M_elems[1].
                 super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                 .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,
                 (IndexPointer)(node->super_IndexPointer).data);
      (node->super_IndexPointer).data = uVar6;
    } while (0xffffffffffffff < uVar6);
  }
  (node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Leaf::DeprecatedFree(ART &art, Node &node) {
	D_ASSERT(node.GetType() == LEAF);

	Node next;
	while (node.HasMetadata()) {
		next = Node::Ref<Leaf>(art, node, LEAF).ptr;
		Node::GetAllocator(art, LEAF).Free(node);
		node = next;
	}
	node.Clear();
}